

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O2

Vec_Bit_t * Acec_MapMajOuts(Gia_Man_t *p,Vec_Int_t *vAdds)

{
  int i;
  Vec_Bit_t *p_00;
  int Entry;
  int i_00;
  
  p_00 = Vec_BitStart(p->nObjs);
  for (i_00 = 4; i_00 + -4 < vAdds->nSize; i_00 = i_00 + 6) {
    i = Vec_IntEntry(vAdds,i_00);
    Vec_BitWriteEntry(p_00,i,Entry);
  }
  return p_00;
}

Assistant:

Vec_Bit_t * Acec_MapMajOuts( Gia_Man_t * p, Vec_Int_t * vAdds )
{
    Vec_Bit_t * vMap = Vec_BitStart( Gia_ManObjNum(p) ); int i;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vAdds, 6*i+4), 1 );
    return vMap;
}